

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O0

unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
__thiscall
jaegertracing::samplers::Config::makeSampler
          (Config *this,string *serviceName,Logger *logger,Metrics *metrics)

{
  bool bVar1;
  ConstSampler *this_00;
  ProbabilisticSampler *this_01;
  invalid_argument *this_02;
  RateLimitingSampler *this_03;
  ulong uVar2;
  RemotelyControlledSampler *this_04;
  ostream *poVar3;
  undefined8 in_R8;
  string local_450 [32];
  ostringstream local_430 [8];
  ostringstream oss;
  unique_ptr<jaegertracing::samplers::RemotelyControlledSampler,_std::default_delete<jaegertracing::samplers::RemotelyControlledSampler>_>
  local_2b8;
  undefined1 local_2b0 [8];
  undefined1 local_2a8 [8];
  shared_ptr<jaegertracing::samplers::Sampler> initSampler;
  Config config;
  string local_238 [32];
  ostringstream local_218 [8];
  ostringstream oss_1;
  unique_ptr<jaegertracing::samplers::ProbabilisticSampler,_std::default_delete<jaegertracing::samplers::ProbabilisticSampler>_>
  local_a0;
  undefined4 local_94;
  unique_ptr<jaegertracing::samplers::ConstSampler,_std::default_delete<jaegertracing::samplers::ConstSampler>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *local_70;
  char *local_68;
  undefined1 local_50 [8];
  string samplerType;
  Metrics *metrics_local;
  Logger *logger_local;
  string *serviceName_local;
  Config *this_local;
  
  samplerType.field_2._8_8_ = in_R8;
  std::__cxx11::string::string((string *)local_50);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)local_50);
  local_68 = (char *)std::begin<std::__cxx11::string>(serviceName);
  local_70 = (char *)std::end<std::__cxx11::string>(serviceName);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::back_inserter<std::__cxx11::string>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_50);
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>,jaegertracing::samplers::Config::makeSampler(std::__cxx11::string_const&,jaegertracing::logging::Logger&,jaegertracing::metrics::Metrics&)const::_lambda(char)_1_>
                       (local_68,local_70,local_78);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,"const");
  if (bVar1) {
    this_00 = (ConstSampler *)operator_new(0x28);
    ConstSampler::ConstSampler(this_00,(bool)(-(*(double *)(serviceName + 1) != 0.0) & 1));
    std::
    unique_ptr<jaegertracing::samplers::ConstSampler,std::default_delete<jaegertracing::samplers::ConstSampler>>
    ::unique_ptr<std::default_delete<jaegertracing::samplers::ConstSampler>,void>
              ((unique_ptr<jaegertracing::samplers::ConstSampler,std::default_delete<jaegertracing::samplers::ConstSampler>>
                *)&local_90,this_00);
    std::
    unique_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>>
    ::
    unique_ptr<jaegertracing::samplers::ConstSampler,std::default_delete<jaegertracing::samplers::ConstSampler>,void>
              ((unique_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>>
                *)this,&local_90);
    std::
    unique_ptr<jaegertracing::samplers::ConstSampler,_std::default_delete<jaegertracing::samplers::ConstSampler>_>
    ::~unique_ptr(&local_90);
    local_94 = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"probabilistic");
    if (bVar1) {
      if ((*(double *)(serviceName + 1) < 0.0) || (1.0 < *(double *)(serviceName + 1))) {
        std::__cxx11::ostringstream::ostringstream(local_218);
        poVar3 = std::operator<<((ostream *)local_218,
                                 "Invalid parameter for probabilistic sampler: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(serviceName + 1));
        std::operator<<(poVar3,", expecting value between 0 and 1");
        std::__cxx11::ostringstream::str();
        (*(code *)(metrics->_tracesStartedSampled)._M_t.
                  super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
                  .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl[2].
                  _vptr_Counter)(metrics,local_238);
        std::__cxx11::string::~string(local_238);
        this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (this_02,"Probabilistic sampling rate should be in the interval [0, 1].");
        __cxa_throw(this_02,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      this_01 = (ProbabilisticSampler *)operator_new(0x30);
      ProbabilisticSampler::ProbabilisticSampler(this_01,*(double *)(serviceName + 1));
      std::
      unique_ptr<jaegertracing::samplers::ProbabilisticSampler,std::default_delete<jaegertracing::samplers::ProbabilisticSampler>>
      ::unique_ptr<std::default_delete<jaegertracing::samplers::ProbabilisticSampler>,void>
                ((unique_ptr<jaegertracing::samplers::ProbabilisticSampler,std::default_delete<jaegertracing::samplers::ProbabilisticSampler>>
                  *)&local_a0,this_01);
      std::
      unique_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>>
      ::
      unique_ptr<jaegertracing::samplers::ProbabilisticSampler,std::default_delete<jaegertracing::samplers::ProbabilisticSampler>,void>
                ((unique_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>>
                  *)this,&local_a0);
      std::
      unique_ptr<jaegertracing::samplers::ProbabilisticSampler,_std::default_delete<jaegertracing::samplers::ProbabilisticSampler>_>
      ::~unique_ptr(&local_a0);
      local_94 = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"ratelimiting");
      if (bVar1) {
        this_03 = (RateLimitingSampler *)operator_new(0x70);
        RateLimitingSampler::RateLimitingSampler(this_03,*(double *)(serviceName + 1));
        std::
        unique_ptr<jaegertracing::samplers::RateLimitingSampler,std::default_delete<jaegertracing::samplers::RateLimitingSampler>>
        ::unique_ptr<std::default_delete<jaegertracing::samplers::RateLimitingSampler>,void>
                  ((unique_ptr<jaegertracing::samplers::RateLimitingSampler,std::default_delete<jaegertracing::samplers::RateLimitingSampler>>
                    *)&config._samplingRefreshInterval,this_03);
        std::
        unique_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>>
        ::
        unique_ptr<jaegertracing::samplers::RateLimitingSampler,std::default_delete<jaegertracing::samplers::RateLimitingSampler>,void>
                  ((unique_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>>
                    *)this,(unique_ptr<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
                            *)&config._samplingRefreshInterval);
        std::
        unique_ptr<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
        ::~unique_ptr((unique_ptr<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
                       *)&config._samplingRefreshInterval);
        local_94 = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_50,"remote");
        if (!bVar1) {
          uVar2 = std::__cxx11::string::empty();
          if ((uVar2 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream(local_430);
            poVar3 = std::operator<<((ostream *)local_430,"Unknown sampler type ");
            std::operator<<(poVar3,(string *)serviceName);
            std::__cxx11::ostringstream::str();
            (*(code *)(metrics->_tracesStartedSampled)._M_t.
                      super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
                      .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl
                      [2]._vptr_Counter)(metrics,local_450);
            std::__cxx11::string::~string(local_450);
            std::
            unique_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>>
            ::unique_ptr<std::default_delete<jaegertracing::samplers::Sampler>,void>
                      ((unique_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>>
                        *)this);
            local_94 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_430);
            goto LAB_003071eb;
          }
        }
        Config((Config *)
               &initSampler.
                super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Config *)serviceName);
        std::__cxx11::string::operator=
                  ((string *)
                   &initSampler.
                    super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,"probabilistic");
        makeSampler((Config *)local_2b0,
                    (string *)
                    &initSampler.
                     super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount,logger,metrics);
        std::shared_ptr<jaegertracing::samplers::Sampler>::
        shared_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>,void>
                  ((shared_ptr<jaegertracing::samplers::Sampler> *)local_2a8,
                   (unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
                    *)local_2b0);
        std::
        unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
        ::~unique_ptr((unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
                       *)local_2b0);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2a8);
        if (bVar1) {
          this_04 = (RemotelyControlledSampler *)operator_new(0xf0);
          jaegertracing::samplers::RemotelyControlledSampler::RemotelyControlledSampler
                    (this_04,(string *)logger,(string *)&serviceName[1]._M_string_length,
                     (shared_ptr *)local_2a8,(int)serviceName[2]._M_string_length,
                     (duration *)serviceName[2].field_2._M_local_buf,(Logger *)metrics,
                     (Metrics *)samplerType.field_2._8_8_);
          std::
          unique_ptr<jaegertracing::samplers::RemotelyControlledSampler,std::default_delete<jaegertracing::samplers::RemotelyControlledSampler>>
          ::unique_ptr<std::default_delete<jaegertracing::samplers::RemotelyControlledSampler>,void>
                    ((unique_ptr<jaegertracing::samplers::RemotelyControlledSampler,std::default_delete<jaegertracing::samplers::RemotelyControlledSampler>>
                      *)&local_2b8,this_04);
          std::
          unique_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>>
          ::
          unique_ptr<jaegertracing::samplers::RemotelyControlledSampler,std::default_delete<jaegertracing::samplers::RemotelyControlledSampler>,void>
                    ((unique_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>>
                      *)this,&local_2b8);
          std::
          unique_ptr<jaegertracing::samplers::RemotelyControlledSampler,_std::default_delete<jaegertracing::samplers::RemotelyControlledSampler>_>
          ::~unique_ptr(&local_2b8);
        }
        else {
          std::
          unique_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>>
          ::unique_ptr<std::default_delete<jaegertracing::samplers::Sampler>,void>
                    ((unique_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>>
                      *)this);
        }
        local_94 = 1;
        std::shared_ptr<jaegertracing::samplers::Sampler>::~shared_ptr
                  ((shared_ptr<jaegertracing::samplers::Sampler> *)local_2a8);
        ~Config((Config *)
                &initSampler.
                 super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
      }
    }
  }
LAB_003071eb:
  std::__cxx11::string::~string((string *)local_50);
  return (__uniq_ptr_data<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>,_true,_true>
          )(__uniq_ptr_data<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Sampler> makeSampler(const std::string& serviceName,
                                         logging::Logger& logger,
                                         metrics::Metrics& metrics) const
    {
        std::string samplerType;
        samplerType.reserve(_type.size());
        std::transform(std::begin(_type),
                       std::end(_type),
                       std::back_inserter(samplerType),
                       [](const char ch) { return std::tolower(ch); });
        if (samplerType == kSamplerTypeConst) {
            return std::unique_ptr<ConstSampler>(new ConstSampler(_param != 0));
        }

        if (samplerType == kSamplerTypeProbabilistic) {
            if (_param >= 0 && _param <= 1) {
                return std::unique_ptr<ProbabilisticSampler>(
                    new ProbabilisticSampler(_param));
            }
            else {
                std::ostringstream oss;
                oss << "Invalid parameter for probabilistic sampler: " << _param
                    << ", expecting value between 0 and 1";
                logger.error(oss.str());
                throw std::invalid_argument("Probabilistic sampling rate should be in the interval [0, 1].");
                return std::unique_ptr<Sampler>();
            }
        }

        if (samplerType == kSamplerTypeRateLimiting) {
            return std::unique_ptr<RateLimitingSampler>(
                new RateLimitingSampler(_param));
        }

        if (samplerType == kSamplerTypeRemote || samplerType.empty()) {
            auto config = *this;
            config._type = kSamplerTypeProbabilistic;
            std::shared_ptr<Sampler> initSampler(
                config.makeSampler(serviceName, logger, metrics));
            if (!initSampler) {
                return std::unique_ptr<Sampler>();
            }

            return std::unique_ptr<RemotelyControlledSampler>(
                new RemotelyControlledSampler(serviceName,
                                              _samplingServerURL,
                                              initSampler,
                                              _maxOperations,
                                              _samplingRefreshInterval,
                                              logger,
                                              metrics));
        }

        std::ostringstream oss;
        oss << "Unknown sampler type " << _type;
        logger.error(oss.str());
        return std::unique_ptr<Sampler>();
    }